

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonObjectFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  byte *pbVar1;
  uint uVar2;
  Mem *pMVar3;
  u32 N;
  char *zIn;
  sqlite3_value *pVal;
  long lVar4;
  long in_FS_OFFSET;
  JsonString local_c0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((argc & 1U) == 0) {
    local_c0.zBuf = local_c0.zSpace;
    local_c0.nAlloc = 100;
    local_c0.nUsed = 0;
    local_c0.bStatic = '\x01';
    local_c0.bErr = '\0';
    local_c0.pCtx = ctx;
    jsonAppendChar(&local_c0,'{');
    if (0 < argc) {
      lVar4 = 0;
      do {
        pVal = argv[lVar4];
        uVar2._0_2_ = pVal->flags;
        uVar2._2_1_ = pVal->enc;
        uVar2._3_1_ = pVal->eSubtype;
        if ((0x4000400040004U >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
          ctx->isError = 1;
          sqlite3VdbeMemSetStr
                    (ctx->pOut,"json_object() labels must be TEXT",-1,'\x01',
                     (_func_void_void_ptr *)0xffffffffffffffff);
          if (local_c0.bStatic == '\0') {
            sqlite3_free(local_c0.zBuf);
          }
          goto LAB_0019f636;
        }
        if ((local_c0.nUsed != 0) && ((local_c0.zBuf[local_c0.nUsed - 1] & 0xdfU) != 0x5b)) {
          jsonAppendChar(&local_c0,',');
          pVal = argv[lVar4];
        }
        zIn = (char *)sqlite3ValueText(pVal,'\x01');
        N = sqlite3ValueBytes(argv[lVar4],'\x01');
        jsonAppendString(&local_c0,zIn,N);
        jsonAppendChar(&local_c0,':');
        jsonAppendValue(&local_c0,argv[lVar4 + 1]);
        lVar4 = lVar4 + 2;
      } while ((int)lVar4 < argc);
    }
    jsonAppendChar(&local_c0,'}');
    if (local_c0.bErr == '\0') {
      sqlite3_result_text64
                (local_c0.pCtx,local_c0.zBuf,local_c0.nUsed,
                 (_func_void_void_ptr *)(-(ulong)(local_c0.bStatic != '\0') | (ulong)sqlite3_free),
                 '\x01');
    }
    pMVar3 = ctx->pOut;
    pMVar3->eSubtype = 'J';
    pbVar1 = (byte *)((long)&pMVar3->flags + 1);
    *pbVar1 = *pbVar1 | 8;
LAB_0019f636:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    ctx->isError = 1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      sqlite3VdbeMemSetStr
                (ctx->pOut,"json_object() requires an even number of arguments",-1,'\x01',
                 (_func_void_void_ptr *)0xffffffffffffffff);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

static void jsonObjectFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  int i;
  JsonString jx;
  const char *z;
  u32 n;

  if( argc&1 ){
    sqlite3_result_error(ctx, "json_object() requires an even number "
                                  "of arguments", -1);
    return;
  }
  jsonInit(&jx, ctx);
  jsonAppendChar(&jx, '{');
  for(i=0; i<argc; i+=2){
    if( sqlite3_value_type(argv[i])!=SQLITE_TEXT ){
      sqlite3_result_error(ctx, "json_object() labels must be TEXT", -1);
      jsonReset(&jx);
      return;
    }
    jsonAppendSeparator(&jx);
    z = (const char*)sqlite3_value_text(argv[i]);
    n = (u32)sqlite3_value_bytes(argv[i]);
    jsonAppendString(&jx, z, n);
    jsonAppendChar(&jx, ':');
    jsonAppendValue(&jx, argv[i+1]);
  }
  jsonAppendChar(&jx, '}');
  jsonResult(&jx);
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}